

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reliveapp.cpp
# Opt level: O0

bool __thiscall relive::ReLiveApp::selectStation(ReLiveApp *this,string *name)

{
  bool bVar1;
  __type_conflict _Var2;
  char *pcVar3;
  ostream *poVar4;
  double dVar5;
  string local_7b8 [39];
  allocator<char> local_791;
  string local_790 [39];
  allocator<char> local_769;
  string local_768 [39];
  allocator<char> local_741;
  string local_740;
  string local_720;
  ostringstream local_700 [8];
  ostringstream os_2;
  allocator<char> local_581;
  string local_580;
  string local_560;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0 [39];
  allocator<char> local_4c9;
  string local_4c8;
  string local_4a8;
  ostringstream local_488 [8];
  ostringstream os_1;
  allocator<char> local_309;
  string local_308;
  string local_2e8;
  reference local_2c8;
  Station *station;
  iterator __end1;
  iterator __begin1;
  vector<relive::Station,_std::allocator<relive::Station>_> *__range1;
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230;
  string local_210;
  ostringstream local_1f0 [8];
  ostringstream os;
  allocator<char> local_61;
  string local_60;
  string local_40;
  string *local_20;
  string *name_local;
  ReLiveApp *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  if (selectStation::_isActive) {
    bVar1 = std::atomic<bool>::load(&selectStation::_init,memory_order_acquire);
    if (!bVar1) {
      if (this == (ReLiveApp *)0x0) {
        __cxa_bad_typeid();
      }
      pcVar3 = std::type_info::name((type_info *)(this->super_Application)._vptr_Application[-1]);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar3,&local_61);
      stripTypeName(&local_40,&local_60);
      LogManager::registerIsActive(&local_40,1,&selectStation::_init,&selectStation::_isActive);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      if ((selectStation::_isActive & 1U) == 0) goto LAB_0011b1b0;
    }
    std::__cxx11::ostringstream::ostringstream(local_1f0);
    poVar4 = std::operator<<((ostream *)local_1f0,"Switching to default station \'");
    poVar4 = std::operator<<(poVar4,(string *)local_20);
    std::operator<<(poVar4,"\'");
    if (this == (ReLiveApp *)0x0) {
      __cxa_bad_typeid();
    }
    pcVar3 = std::type_info::name((type_info *)(this->super_Application)._vptr_Application[-1]);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,pcVar3,&local_231);
    stripTypeName(&local_210,&local_230);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/src/frontend/imgui/reliveapp.cpp"
               ,&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_280,"bool relive::ReLiveApp::selectStation(const std::string &)",&local_281);
    dVar5 = (double)std::__cxx11::ostringstream::str();
    LogManager::log(dVar5);
    std::__cxx11::string::~string((string *)&__range1);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator(&local_281);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator(&local_259);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::__cxx11::ostringstream::~ostringstream(local_1f0);
  }
LAB_0011b1b0:
  __end1 = std::vector<relive::Station,_std::allocator<relive::Station>_>::begin(&this->_stations);
  station = (Station *)
            std::vector<relive::Station,_std::allocator<relive::Station>_>::end(&this->_stations);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<relive::Station_*,_std::vector<relive::Station,_std::allocator<relive::Station>_>_>
                                *)&station);
    if (!bVar1) {
      return false;
    }
    local_2c8 = __gnu_cxx::
                __normal_iterator<relive::Station_*,_std::vector<relive::Station,_std::allocator<relive::Station>_>_>
                ::operator*(&__end1);
    if ((selectStation(std::__cxx11::string_const&)::_isActive & 1U) != 0) {
      bVar1 = std::atomic<bool>::load
                        (&selectStation(std::__cxx11::string_const&)::_init,memory_order_acquire);
      if (!bVar1) {
        if (this == (ReLiveApp *)0x0) {
          __cxa_bad_typeid();
        }
        pcVar3 = std::type_info::name((type_info *)(this->super_Application)._vptr_Application[-1]);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,pcVar3,&local_309);
        stripTypeName(&local_2e8,&local_308);
        LogManager::registerIsActive
                  (&local_2e8,2,&selectStation(std::__cxx11::string_const&)::_init,
                   &selectStation(std::__cxx11::string_const&)::_isActive);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_308);
        std::allocator<char>::~allocator(&local_309);
        if ((selectStation(std::__cxx11::string_const&)::_isActive & 1U) == 0) goto LAB_0011b623;
      }
      std::__cxx11::ostringstream::ostringstream(local_488);
      poVar4 = std::operator<<((ostream *)local_488,"comparing to \'");
      poVar4 = std::operator<<(poVar4,(string *)&local_2c8->_name);
      std::operator<<(poVar4,"\'");
      if (this == (ReLiveApp *)0x0) {
        __cxa_bad_typeid();
      }
      pcVar3 = std::type_info::name((type_info *)(this->super_Application)._vptr_Application[-1]);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,pcVar3,&local_4c9);
      stripTypeName(&local_4a8,&local_4c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_4f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/src/frontend/imgui/reliveapp.cpp"
                 ,&local_4f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_518,"bool relive::ReLiveApp::selectStation(const std::string &)",&local_519);
      dVar5 = (double)std::__cxx11::ostringstream::str();
      LogManager::log(dVar5);
      std::__cxx11::string::~string(local_540);
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator(&local_519);
      std::__cxx11::string::~string(local_4f0);
      std::allocator<char>::~allocator(&local_4f1);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator(&local_4c9);
      std::__cxx11::ostringstream::~ostringstream(local_488);
    }
LAB_0011b623:
    _Var2 = std::operator==(&local_2c8->_name,local_20);
    if (_Var2) {
      if ((selectStation(std::__cxx11::string_const&)::_isActive & 1U) != 0) {
        bVar1 = std::atomic<bool>::load
                          (&selectStation(std::__cxx11::string_const&)::_init,memory_order_acquire);
        if (!bVar1) {
          if (this == (ReLiveApp *)0x0) {
            __cxa_bad_typeid();
          }
          pcVar3 = std::type_info::name
                             ((type_info *)(this->super_Application)._vptr_Application[-1]);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,pcVar3,&local_581)
          ;
          stripTypeName(&local_560,&local_580);
          LogManager::registerIsActive
                    (&local_560,2,&selectStation(std::__cxx11::string_const&)::_init,
                     &selectStation(std::__cxx11::string_const&)::_isActive);
          std::__cxx11::string::~string((string *)&local_560);
          std::__cxx11::string::~string((string *)&local_580);
          std::allocator<char>::~allocator(&local_581);
          if ((selectStation(std::__cxx11::string_const&)::_isActive & 1U) == 0) goto LAB_0011ba49;
        }
        std::__cxx11::ostringstream::ostringstream(local_700);
        poVar4 = std::operator<<((ostream *)local_700,"found \'");
        poVar4 = std::operator<<(poVar4,(string *)&local_2c8->_name);
        std::operator<<(poVar4,"\'");
        if (this == (ReLiveApp *)0x0) {
          __cxa_bad_typeid();
        }
        pcVar3 = std::type_info::name((type_info *)(this->super_Application)._vptr_Application[-1]);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,pcVar3,&local_741);
        stripTypeName(&local_720,&local_740);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_768,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/src/frontend/imgui/reliveapp.cpp"
                   ,&local_769);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_790,"bool relive::ReLiveApp::selectStation(const std::string &)",&local_791
                  );
        dVar5 = (double)std::__cxx11::ostringstream::str();
        LogManager::log(dVar5);
        std::__cxx11::string::~string(local_7b8);
        std::__cxx11::string::~string(local_790);
        std::allocator<char>::~allocator(&local_791);
        std::__cxx11::string::~string(local_768);
        std::allocator<char>::~allocator(&local_769);
        std::__cxx11::string::~string((string *)&local_720);
        std::__cxx11::string::~string((string *)&local_740);
        std::allocator<char>::~allocator(&local_741);
        std::__cxx11::ostringstream::~ostringstream(local_700);
      }
LAB_0011ba49:
      selectStation(this,local_2c8);
      return true;
    }
    __gnu_cxx::
    __normal_iterator<relive::Station_*,_std::vector<relive::Station,_std::allocator<relive::Station>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool ReLiveApp::selectStation(const std::string& name)
{
    DEBUG_LOG(1, "Switching to default station '" << name << "'");
    for (const auto& station : _stations) {
        DEBUG_LOG(2, "comparing to '" << station._name << "'");
        if (station._name == name) {
            DEBUG_LOG(2, "found '" << station._name << "'");
            selectStation(station);
            return true;
        }
    }
    return false;
}